

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# router.cpp
# Opt level: O1

void __thiscall
zmq::router_t::xattach_pipe
          (router_t *this,pipe_t *pipe_,bool subscribe_to_all_,bool locally_initiated_)

{
  bool bVar1;
  int iVar2;
  undefined3 in_register_00000009;
  undefined4 uVar3;
  undefined4 in_register_0000000c;
  void *extraout_RDX;
  void *__buf;
  void *extraout_RDX_00;
  msg_t *pmVar4;
  msg_t probe_msg;
  pipe_t *local_60;
  msg_t local_58;
  
  uVar3 = CONCAT31(in_register_00000009,locally_initiated_);
  local_60 = pipe_;
  if (pipe_ == (pipe_t *)0x0) {
    xattach_pipe();
  }
  if (this->_probe_router == true) {
    iVar2 = msg_t::init(&local_58,(EVP_PKEY_CTX *)pipe_);
    __buf = extraout_RDX;
    if (iVar2 != 0) {
      xattach_pipe();
      __buf = extraout_RDX_00;
    }
    pmVar4 = &local_58;
    pipe_t::write(local_60,(int)&local_58,__buf,CONCAT44(in_register_0000000c,uVar3));
    iVar2 = (int)pmVar4;
    pipe_t::flush(local_60);
    iVar2 = msg_t::close(&local_58,iVar2);
    if (iVar2 != 0) {
      xattach_pipe();
    }
  }
  bVar1 = identify_peer(this,local_60,locally_initiated_);
  if (bVar1) {
    fq_t::attach(&this->_fq,local_60);
  }
  else {
    std::
    _Rb_tree<zmq::pipe_t*,zmq::pipe_t*,std::_Identity<zmq::pipe_t*>,std::less<zmq::pipe_t*>,std::allocator<zmq::pipe_t*>>
    ::_M_insert_unique<zmq::pipe_t*const&>
              ((_Rb_tree<zmq::pipe_t*,zmq::pipe_t*,std::_Identity<zmq::pipe_t*>,std::less<zmq::pipe_t*>,std::allocator<zmq::pipe_t*>>
                *)&this->_anonymous_pipes,&local_60);
  }
  return;
}

Assistant:

void zmq::router_t::xattach_pipe (pipe_t *pipe_,
                                  bool subscribe_to_all_,
                                  bool locally_initiated_)
{
    LIBZMQ_UNUSED (subscribe_to_all_);

    zmq_assert (pipe_);

    if (_probe_router) {
        msg_t probe_msg;
        int rc = probe_msg.init ();
        errno_assert (rc == 0);

        rc = pipe_->write (&probe_msg);
        // zmq_assert (rc) is not applicable here, since it is not a bug.
        LIBZMQ_UNUSED (rc);

        pipe_->flush ();

        rc = probe_msg.close ();
        errno_assert (rc == 0);
    }

    const bool routing_id_ok = identify_peer (pipe_, locally_initiated_);
    if (routing_id_ok)
        _fq.attach (pipe_);
    else
        _anonymous_pipes.insert (pipe_);
}